

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAllocPtr alloc)

{
  SRes SVar1;
  CLzmaProb *pCVar2;
  undefined8 *in_RCX;
  UInt32 UVar3;
  
  UVar3 = (0x300 << ((char)propNew + (char)alloc & 0x1fU)) + 0x7c0;
  if ((p->probs == (CLzmaProb *)0x0) || (SVar1 = 0, UVar3 != p->numProbs)) {
    (*(code *)in_RCX[1])();
    p->probs = (CLzmaProb *)0x0;
    pCVar2 = (CLzmaProb *)(*(code *)*in_RCX)();
    p->probs = pCVar2;
    if (pCVar2 == (CLzmaProb *)0x0) {
      SVar1 = 2;
    }
    else {
      p->probs_1664 = pCVar2 + 0x680;
      p->numProbs = UVar3;
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec *p, const CLzmaProps *propNew, ISzAllocPtr alloc)
{
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (!p->probs || numProbs != p->numProbs)
  {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb *)ISzAlloc_Alloc(alloc, numProbs * sizeof(CLzmaProb));
    if (!p->probs)
      return SZ_ERROR_MEM;
    p->probs_1664 = p->probs + 1664;
    p->numProbs = numProbs;
  }
  return SZ_OK;
}